

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O2

void __thiscall duckdb::MetadataWriter::NextBlock(MetadataWriter *this)

{
  MetadataPointer *pMVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *this_00;
  MetadataHandle new_handle;
  MetadataHandle local_40;
  MetaBlockPointer local_20;
  
  (*(this->super_WriteStream)._vptr_WriteStream[3])(&local_40,this);
  if (this->capacity != 0) {
    pMVar1 = (MetadataPointer *)BasePtr(this);
    *pMVar1 = local_40.pointer;
  }
  MetadataHandle::operator=(&this->block,&local_40);
  this->current_pointer = (this->block).pointer;
  this->offset = 8;
  iVar2 = MetadataManager::GetMetadataBlockSize(this->manager);
  this->capacity = iVar2;
  pdVar3 = BasePtr(this);
  pdVar3[0] = 0xff;
  pdVar3[1] = 0xff;
  pdVar3[2] = 0xff;
  pdVar3[3] = 0xff;
  pdVar3[4] = 0xff;
  pdVar3[5] = 0xff;
  pdVar3[6] = 0xff;
  pdVar3[7] = 0xff;
  if ((this->written_pointers).ptr != (vector<duckdb::MetaBlockPointer,_true> *)0x0) {
    this_00 = &optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::operator->
                         (&this->written_pointers)->
               super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>;
    local_20.block_pointer = *(idx_t *)&this->current_pointer;
    local_20.offset = 0;
    local_20.unused_padding = 0;
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
    emplace_back<duckdb::MetaBlockPointer>(this_00,&local_20);
  }
  BufferHandle::~BufferHandle(&local_40.handle);
  return;
}

Assistant:

void MetadataWriter::NextBlock() {
	// now we need to get a new block id
	auto new_handle = NextHandle();

	// write the block id of the new block to the start of the current block
	if (capacity > 0) {
		auto disk_block = manager.GetDiskPointer(new_handle.pointer);
		Store<idx_t>(disk_block.block_pointer, BasePtr());
	}
	// now update the block id of the block
	block = std::move(new_handle);
	current_pointer = block.pointer;
	offset = sizeof(idx_t);
	capacity = GetManager().GetMetadataBlockSize();
	Store<idx_t>(static_cast<idx_t>(-1), BasePtr());
	if (written_pointers) {
		written_pointers->push_back(manager.GetDiskPointer(current_pointer));
	}
}